

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O3

TestResult * __thiscall JsonTest::TestResult::operator<<(TestResult *this,Int64 value)

{
  LargestInt in_RDX;
  string local_28;
  
  Json::valueToString_abi_cxx11_(&local_28,(Json *)value,in_RDX);
  if (this->messageTarget_ != (Failure *)0x0) {
    std::__cxx11::string::_M_append
              ((char *)&this->messageTarget_->message_,(ulong)local_28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return this;
}

Assistant:

TestResult& TestResult::operator<<(Json::Int64 value) {
  return addToLastFailure(Json::valueToString(value));
}